

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

bool __thiscall
embree::SceneGraph::TransformNode::calculateClosed(TransformNode *this,bool group_instancing)

{
  bool *pbVar1;
  Node *pNVar2;
  int iVar3;
  
  if ((this->super_Node).closed == false) {
    (this->super_Node).closed = group_instancing;
    pNVar2 = (this->child).ptr;
    iVar3 = (*(pNVar2->super_RefCount)._vptr_RefCount[7])(pNVar2,(ulong)group_instancing);
    pbVar1 = &(this->super_Node).closed;
    *pbVar1 = (bool)(*pbVar1 & (byte)iVar3);
    (this->super_Node).hasLightOrCamera = ((this->child).ptr)->hasLightOrCamera;
  }
  return (bool)((this->super_Node).indegree == 1 & (this->super_Node).closed);
}

Assistant:

bool SceneGraph::TransformNode::calculateClosed(bool group_instancing) 
  {
    assert(indegree);
    if (!closed) {
      closed = group_instancing;
      closed &= child->calculateClosed(group_instancing);
      hasLightOrCamera = child->hasLightOrCamera;
    }
    return closed && (indegree == 1);
  }